

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmTim.c
# Opt level: O1

int Sfm_TimSortArrayByArrival(Sfm_Tim_t *p,Vec_Int_t *vNodes,int iPivot)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  word wVar4;
  uint uVar5;
  int iVar6;
  word *pwVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  
  if (iPivot < 0) {
LAB_004bf2c6:
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                  ,0x10b,"int Abc_Var2Lit(int, int)");
  }
  uVar5 = iPivot * 2;
  uVar1 = (p->vTimArrs).nSize;
  if (uVar1 == uVar5 || SBORROW4(uVar1,uVar5) != (int)(uVar1 + iPivot * -2) < 0) {
LAB_004bf2e5:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
  piVar3 = (p->vTimArrs).pArray;
  iVar10 = piVar3[uVar5];
  iVar6 = piVar3[(ulong)uVar5 + 1];
  if (iVar6 < iVar10) {
    iVar6 = iVar10;
  }
  if (p->DeltaCrit < 1) {
    __assert_fail("p->DeltaCrit > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmTim.c"
                  ,0x155,"int Sfm_TimSortArrayByArrival(Sfm_Tim_t *, Vec_Int_t *, int)");
  }
  (p->vSortData).nSize = 0;
  if (0 < vNodes->nSize) {
    lVar8 = 0;
    do {
      uVar1 = vNodes->pArray[lVar8];
      uVar9 = (ulong)uVar1;
      if ((int)uVar1 < 0) goto LAB_004bf2c6;
      if ((p->vTimArrs).nSize <= (int)(uVar1 * 2)) goto LAB_004bf2e5;
      piVar3 = (p->vTimArrs).pArray;
      iVar10 = piVar3[uVar9 * 2];
      iVar2 = piVar3[uVar9 * 2 + 1];
      if (iVar2 < iVar10) {
        iVar2 = iVar10;
      }
      uVar1 = (p->vSortData).nCap;
      if ((p->vSortData).nSize == uVar1) {
        if ((int)uVar1 < 0x10) {
          pwVar7 = (p->vSortData).pArray;
          if (pwVar7 == (word *)0x0) {
            pwVar7 = (word *)malloc(0x80);
          }
          else {
            pwVar7 = (word *)realloc(pwVar7,0x80);
          }
          (p->vSortData).pArray = pwVar7;
          iVar10 = 0x10;
        }
        else {
          iVar10 = uVar1 * 2;
          if (iVar10 <= (int)uVar1) goto LAB_004bf21f;
          pwVar7 = (p->vSortData).pArray;
          if (pwVar7 == (word *)0x0) {
            pwVar7 = (word *)malloc((ulong)uVar1 << 4);
          }
          else {
            pwVar7 = (word *)realloc(pwVar7,(ulong)uVar1 << 4);
          }
          (p->vSortData).pArray = pwVar7;
        }
        if (pwVar7 == (word *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                        ,0x1e4,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
        }
        (p->vSortData).nCap = iVar10;
      }
LAB_004bf21f:
      iVar10 = (p->vSortData).nSize;
      (p->vSortData).nSize = iVar10 + 1;
      (p->vSortData).pArray[iVar10] = (long)iVar2 | uVar9 << 0x20;
      lVar8 = lVar8 + 1;
    } while (lVar8 < vNodes->nSize);
  }
  Abc_QuickSort3((p->vSortData).pArray,(p->vSortData).nSize,0);
  vNodes->nSize = 0;
  if ((p->vSortData).nSize < 1) {
    iVar10 = -1;
  }
  else {
    iVar10 = -1;
    lVar8 = 0;
    do {
      wVar4 = (p->vSortData).pArray[lVar8];
      Vec_IntPush(vNodes,(int)(wVar4 >> 0x20));
      if (iVar10 == -1) {
        iVar10 = -1;
        if (iVar6 < (int)wVar4 + p->DeltaCrit) {
          iVar10 = (int)lVar8;
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < (p->vSortData).nSize);
  }
  return iVar10;
}

Assistant:

int Sfm_TimSortArrayByArrival( Sfm_Tim_t * p, Vec_Int_t * vNodes, int iPivot )
{
    word Entry; 
    int i, Id, nDivNew = -1; 
    int MaxDelay = Sfm_TimArrMaxId(p, iPivot);
    assert( p->DeltaCrit > 0 );
    // collect nodes
    Vec_WrdClear( &p->vSortData );
    Vec_IntForEachEntry( vNodes, Id, i )
        Vec_WrdPush( &p->vSortData, ((word)Id << 32) | Sfm_TimArrMaxId(p, Id) );
    // sort nodes by delay
    Abc_QuickSort3( Vec_WrdArray(&p->vSortData), Vec_WrdSize(&p->vSortData), 0 );
    // collect sorted nodes and find place where divisors end
    Vec_IntClear( vNodes );
    Vec_WrdForEachEntry( &p->vSortData, Entry, i )
    {
        Vec_IntPush( vNodes, (int)(Entry >> 32) );
        if ( nDivNew == -1 && ((int)Entry) + p->DeltaCrit > MaxDelay )
            nDivNew = i;
    }
    return nDivNew;
}